

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# float_conversion.cc
# Opt level: O0

bool absl::lts_20250127::str_format_internal::(anonymous_namespace)::
     FloatToBuffer<(absl::lts_20250127::str_format_internal::(anonymous_namespace)::FormatStyle)1,long_double>
               (Decomposed<long_double> decomposed,size_t precision,Buffer *out,int *exp)

{
  undefined1 int_mantissa [16];
  bool bVar1;
  unsigned_long int_mantissa_00;
  _anonymous_namespace_ *this;
  int exp_00;
  uint128 *this_00;
  undefined8 in_stack_ffffffffffffffa8;
  Decomposed<long_double> *this_01;
  int *exp_local;
  Buffer *out_local;
  size_t precision_local;
  
  this_01 = &decomposed;
  if (precision < 0x28) {
    int_mantissa_00 = uint128::operator_cast_to_unsigned_long(&this_01->mantissa);
    this_00 = (uint128 *)(ulong)(uint)this_01->exponent;
    bVar1 = FloatToBufferImpl<unsigned_long,long_double,(absl::lts_20250127::str_format_internal::(anonymous_namespace)::FormatStyle)1>
                      (int_mantissa_00,this_01->exponent,precision,out,exp);
    if (bVar1) {
      precision_local._7_1_ = true;
    }
    else {
      this = (_anonymous_namespace_ *)
             uint128::operator_cast_to_unsigned___int128((unsigned___int128 *)this_01,this_00);
      int_mantissa._8_8_ = this_01;
      int_mantissa._0_8_ = in_stack_ffffffffffffffa8;
      precision_local._7_1_ =
           FloatToBufferImpl<unsigned__int128,long_double,(absl::lts_20250127::str_format_internal::(anonymous_namespace)::FormatStyle)1>
                     (this,(unsigned___int128)int_mantissa,exp_00,(ulong)(uint)this_01->exponent,
                      (Buffer *)precision,(int *)out);
    }
  }
  else {
    precision_local._7_1_ = false;
  }
  return precision_local._7_1_;
}

Assistant:

bool FloatToBuffer(Decomposed<Float> decomposed,
                   size_t precision,
                   Buffer* out,
                   int* exp) {
  if (precision > kMaxFixedPrecision) return false;

  // Try with uint64_t.
  if (CanFitMantissa<Float, std::uint64_t>() &&
      FloatToBufferImpl<std::uint64_t, Float, mode>(
          static_cast<std::uint64_t>(decomposed.mantissa), decomposed.exponent,
          precision, out, exp))
    return true;

#if defined(ABSL_HAVE_INTRINSIC_INT128)
  // If that is not enough, try with __uint128_t.
  return CanFitMantissa<Float, __uint128_t>() &&
         FloatToBufferImpl<__uint128_t, Float, mode>(
             static_cast<__uint128_t>(decomposed.mantissa), decomposed.exponent,
             precision, out, exp);
#endif
  return false;
}